

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sp_lev.c
# Opt level: O2

void flip_drawbridge_vertical(rm *loc)

{
  uint uVar1;
  uint uVar2;
  
  if ((loc->typ == '$') || (loc->typ == '\x14')) {
    uVar1 = *(uint *)&loc->field_0x6;
    uVar2 = uVar1 >> 4 & 3;
    if (uVar2 == 1) {
      uVar1 = uVar1 & 0xffffffcf;
    }
    else {
      if (uVar2 != 0) {
        return;
      }
      uVar1 = uVar1 & 0xffffffcf | 0x10;
    }
    *(uint *)&loc->field_0x6 = uVar1;
  }
  return;
}

Assistant:

static void flip_drawbridge_vertical(struct rm *loc)
{
	if (IS_DRAWBRIDGE(loc->typ)) {
	    if ((loc->drawbridgemask & DB_DIR) == DB_NORTH) {
		loc->drawbridgemask &= ~DB_NORTH;
		loc->drawbridgemask |=  DB_SOUTH;
	    } else if ((loc->drawbridgemask & DB_DIR) == DB_SOUTH) {
		loc->drawbridgemask &= ~DB_SOUTH;
		loc->drawbridgemask |=  DB_NORTH;
	    }
	}
}